

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraphInternal::EqualsCondition::Evaluate
          (EqualsCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  __type _Var1;
  ExpandMacroResult EVar2;
  bool bVar3;
  string rhs;
  string lhs;
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)&this->Lhs);
  EVar2 = ExpandMacros(&local_48,expanders,version);
  if (EVar2 == Ignore) {
    bVar3 = true;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar2 == Error) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string((string *)&sStack_68,(string *)&this->Rhs);
    EVar2 = ExpandMacros(&sStack_68,expanders,version);
    if (EVar2 == Ignore) {
      bVar3 = true;
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
    }
    else if (EVar2 == Error) {
      bVar3 = false;
    }
    else {
      _Var1 = std::operator==(&local_48,&sStack_68);
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
           (_Optional_payload_base<bool>)(_Var1 | 0x100);
      bVar3 = true;
    }
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar3;
}

Assistant:

bool cmCMakePresetsGraphInternal::EqualsCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string lhs = this->Lhs;
  CHECK_EXPAND(out, lhs, expanders, version);

  std::string rhs = this->Rhs;
  CHECK_EXPAND(out, rhs, expanders, version);

  out = (lhs == rhs);
  return true;
}